

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O3

int __thiscall QResourceFileEngine::open(QResourceFileEngine *this,char *__file,int __oflag,...)

{
  QResourceFileEnginePrivate *this_00;
  QResourcePrivate *pQVar1;
  long lVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  undefined8 extraout_RAX;
  int iVar6;
  QArrayData *pQVar7;
  long in_FS_OFFSET;
  QString local_38;
  long local_20;
  
  iVar6 = (int)__file;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QResourceFileEnginePrivate *)(this->super_QAbstractFileEngine).d_ptr.d;
  pQVar1 = (this_00->resource).d_ptr.d;
  QResourcePrivate::ensureInitialized(pQVar1);
  pQVar7 = &((pQVar1->fileName).d.d)->super_QArrayData;
  lVar2 = (pQVar1->fileName).d.size;
  if (pQVar7 != (QArrayData *)0x0) {
    LOCK();
    (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      iVar6 = 2;
      QArrayData::deallocate(pQVar7,2,0x10);
    }
  }
  if (lVar2 == 0) {
    open((char *)pQVar7,iVar6);
  }
  else if (((ulong)__file & 2) == 0) {
    pQVar1 = (this_00->resource).d_ptr.d;
    QResourcePrivate::ensureInitialized(pQVar1);
    if (pQVar1->compressionAlgo == '\0') {
LAB_00252da7:
      pQVar1 = (this_00->resource).d_ptr.d;
      QResourcePrivate::ensureInitialized(pQVar1);
      iVar6 = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      if ((pQVar1->related).d.size != 0) goto LAB_00252e19;
      iVar6 = 2;
    }
    else {
      QResourceFileEnginePrivate::uncompress(this_00);
      bVar5 = QByteArray::isNull(&this_00->uncompressed);
      if (!bVar5) goto LAB_00252da7;
      iVar6 = 5;
    }
    QSystemError::stdString(&local_38,iVar6);
    pQVar7 = &((this_00->super_QAbstractFileEnginePrivate).errorString.d.d)->super_QArrayData;
    pcVar3 = (this_00->super_QAbstractFileEnginePrivate).errorString.d.ptr;
    (this_00->super_QAbstractFileEnginePrivate).errorString.d.d = local_38.d.d;
    (this_00->super_QAbstractFileEnginePrivate).errorString.d.ptr = local_38.d.ptr;
    qVar4 = (this_00->super_QAbstractFileEnginePrivate).errorString.d.size;
    (this_00->super_QAbstractFileEnginePrivate).errorString.d.size = local_38.d.size;
    local_38.d.d = (Data *)pQVar7;
    local_38.d.ptr = pcVar3;
    local_38.d.size = qVar4;
    if (pQVar7 != (QArrayData *)0x0) {
      LOCK();
      (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar7,2,0x10);
      }
    }
  }
  iVar6 = 0;
LAB_00252e19:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QResourceFileEngine::open(QIODevice::OpenMode flags,
                               std::optional<QFile::Permissions> permissions)
{
    Q_UNUSED(permissions);

    Q_D(QResourceFileEngine);
    if (d->resource.fileName().isEmpty()) {
        qWarning("QResourceFileEngine::open: Missing file name");
        return false;
    }
    if (flags & QIODevice::WriteOnly)
        return false;
    if (d->resource.compressionAlgorithm() != QResource::NoCompression) {
        d->uncompress();
        if (d->uncompressed.isNull()) {
            d->errorString = QSystemError::stdString(EIO);
            return false;
        }
    }
    if (!d->resource.isValid()) {
        d->errorString = QSystemError::stdString(ENOENT);
        return false;
    }
    return true;
}